

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O3

REF_STATUS
ref_phys_euler_dual_flux(REF_GRID ref_grid,REF_INT ldim,REF_DBL *primitive_dual,REF_DBL *dual_flux)

{
  undefined8 *puVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  REF_NODE pRVar6;
  REF_GLOB *pRVar7;
  double dVar8;
  double dVar9;
  long lVar10;
  REF_DBL *pRVar11;
  undefined8 uVar12;
  REF_DBL *pRVar13;
  long lVar14;
  char *pcVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  double dVar20;
  double local_58 [4];
  double local_38 [5];
  
  if ((ldim & 1U) == 0) {
    if (9 < ldim) {
      pRVar6 = ref_grid->node;
      iVar5 = pRVar6->max;
      lVar10 = (long)iVar5;
      if (0 < lVar10) {
        pRVar7 = pRVar6->global;
        pRVar11 = primitive_dual + ((uint)ldim >> 1);
        lVar17 = 0;
        pRVar13 = dual_flux;
        do {
          if (-1 < pRVar7[lVar17]) {
            lVar18 = 0;
            do {
              pRVar13[lVar18] = pRVar11[lVar18];
              lVar18 = lVar18 + 1;
            } while (lVar18 != 5);
          }
          lVar17 = lVar17 + 1;
          pRVar13 = pRVar13 + 0x14;
          pRVar11 = pRVar11 + (uint)ldim;
        } while (lVar17 != lVar10);
        if (0 < iVar5) {
          pRVar7 = pRVar6->global;
          uVar16 = 0x20;
          lVar17 = 0;
          do {
            if (-1 < pRVar7[lVar17]) {
              uVar19 = uVar16 & 0x7ffffffe0;
              puVar1 = (undefined8 *)((long)dual_flux + uVar19 + 0x68);
              *puVar1 = 0;
              puVar1[1] = 0;
              puVar1 = (undefined8 *)((long)dual_flux + uVar19 + 0x58);
              *puVar1 = 0;
              puVar1[1] = 0;
              puVar1 = (undefined8 *)((long)dual_flux + uVar19 + 0x48);
              *puVar1 = 0;
              puVar1[1] = 0;
              puVar1 = (undefined8 *)((long)dual_flux + uVar19 + 0x38);
              *puVar1 = 0;
              puVar1[1] = 0;
              puVar1 = (undefined8 *)((long)dual_flux + uVar19 + 0x28);
              *puVar1 = 0;
              puVar1[1] = 0;
              puVar1 = (undefined8 *)((long)dual_flux + uVar19 + 0x18);
              *puVar1 = 0;
              puVar1[1] = 0;
              puVar1 = (undefined8 *)((long)dual_flux + uVar19 + 8);
              *puVar1 = 0;
              puVar1[1] = 0;
              *(undefined8 *)((long)dual_flux + uVar19 + 0x78) = 0;
            }
            lVar17 = lVar17 + 1;
            uVar16 = uVar16 + 0xa0;
          } while (lVar10 != lVar17);
          if (0 < iVar5) {
            pRVar7 = pRVar6->global;
            pRVar11 = dual_flux + 5;
            lVar17 = 0;
            do {
              if (-1 < pRVar7[lVar17]) {
                uVar16 = (ulong)(uint)((int)lVar17 * ldim);
                dVar2 = primitive_dual[uVar16];
                dVar8 = primitive_dual[uVar16 + 1];
                dVar9 = (primitive_dual + uVar16 + 1)[1];
                dVar3 = primitive_dual[uVar16 + 3];
                dVar4 = primitive_dual[uVar16 + 4];
                lVar18 = 0;
                pRVar13 = pRVar11;
                do {
                  local_58[0] = 0.0;
                  local_58[1] = 0.0;
                  local_58[2] = 0.0;
                  local_58[lVar18] = 1.0;
                  dVar20 = dVar3 * local_58[2] + dVar8 * local_58[0] + dVar9 * local_58[1];
                  local_38[0] = dVar2 * dVar20;
                  local_38[1] = local_38[0] * dVar8 + local_58[0] * dVar4;
                  local_38[2] = local_38[0] * dVar9 + local_58[1] * dVar4;
                  local_38[3] = local_38[0] * dVar3 + local_58[2] * dVar4;
                  local_38[4] = dVar20 * ((dVar3 * dVar3 + dVar8 * dVar8 + dVar9 * dVar9) *
                                          dVar2 * 0.5 + dVar4 / 0.3999999999999999 + dVar4);
                  lVar14 = 0;
                  do {
                    pRVar13[lVar14] = local_38[lVar14] + pRVar13[lVar14];
                    lVar14 = lVar14 + 1;
                  } while (lVar14 != 5);
                  lVar18 = lVar18 + 1;
                  pRVar13 = pRVar13 + 5;
                } while (lVar18 != 3);
              }
              lVar17 = lVar17 + 1;
              pRVar11 = pRVar11 + 0x14;
            } while (lVar17 != lVar10);
          }
        }
      }
      return 0;
    }
    pcVar15 = "expect ldim >= 10";
    uVar12 = 0x144;
  }
  else {
    pcVar15 = "expect even ldim";
    uVar12 = 0x143;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar12,
         "ref_phys_euler_dual_flux",pcVar15);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_phys_euler_dual_flux(REF_GRID ref_grid, REF_INT ldim,
                                            REF_DBL *primitive_dual,
                                            REF_DBL *dual_flux) {
  REF_INT i, node, dir, nvar;
  REF_DBL direction[3], state[5], flux[5];

  RAS(0 == ldim % 2, "expect even ldim");
  RAS(ldim >= 10, "expect ldim >= 10");
  nvar = ldim / 2;
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    for (i = 0; i < 5; i++) {
      dual_flux[i + 20 * node] = primitive_dual[nvar + i + ldim * node];
    }
  }

  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    for (i = 0; i < 15; i++) {
      dual_flux[5 + i + 20 * node] = 0.0;
    }
  }

  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    for (i = 0; i < 5; i++) {
      state[i] = primitive_dual[i + ldim * node];
    }
    for (dir = 0; dir < 3; dir++) {
      direction[0] = 0;
      direction[1] = 0;
      direction[2] = 0;
      direction[dir] = 1;
      RSS(ref_phys_euler(state, direction, flux), "euler");
      for (i = 0; i < 5; i++) {
        dual_flux[i + 5 + 5 * dir + 20 * node] += flux[i];
      }
    }
  }
  return REF_SUCCESS;
}